

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall ProString::contains(ProString *this,char *s,CaseSensitivity cs)

{
  int iVar1;
  long in_FS_OFFSET;
  QLatin1StringView local_48;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QLatin1String::QLatin1String(&local_48,s);
  QString::QString((QString *)&local_38,local_48);
  iVar1 = indexOf(this,(QString *)&local_38,0,cs);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return -1 < iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool contains(const char *s, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return indexOf(QLatin1String(s), 0, cs) >= 0; }